

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int lj_opt_fwd_wasnonnil(jit_State *J,IROpT loadop,IRRef xref)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  IRIns *pIVar4;
  IRIns *load;
  IRRef xkref;
  IRRef skref;
  IRIns *store;
  IRRef ref;
  IRRef xref_local;
  IROpT loadop_local;
  jit_State *J_local;
  
  uVar1 = J->chain[(int)(loadop + 7)];
  do {
    ref = (IRRef)uVar1;
    if (ref <= xref) {
      uVar1 = J->chain[loadop];
      while( true ) {
        ref = (IRRef)uVar1;
        if (ref <= xref) {
          return 0;
        }
        pIVar4 = (J->cur).ir + ref;
        if ((pIVar4->field_0).op1 == xref) break;
        uVar1 = (pIVar4->field_0).prev;
      }
      return (uint)((((pIVar4->field_1).t.irt & 0x1f) == 0 ^ 0xffU) & 1);
    }
    pIVar4 = (J->cur).ir + ref;
    if ((pIVar4->field_0).op1 == xref) {
      return (uint)((((pIVar4->field_1).t.irt & 0x1f) == 0 ^ 0xffU) & 1);
    }
    if (((pIVar4->field_1).t.irt & 0x1f) == 0) {
      uVar2 = (uint)*(ushort *)((long)(J->cur).ir + (ulong)(pIVar4->field_0).op1 * 8 + 2);
      uVar3 = (uint)*(ushort *)((long)(J->cur).ir + (ulong)xref * 8 + 2);
      if ((loadop == 0x41) ||
         (((*(byte *)((long)(J->cur).ir + (ulong)uVar2 * 8 + 4) ^
           *(byte *)((long)(J->cur).ir + (ulong)uVar3 * 8 + 4)) & 0x1f) == 0)) {
        if ((uVar2 == uVar3) || ((0x7fff < uVar2 || (0x7fff < uVar3)))) {
          return 0;
        }
      }
      else if (((*(byte *)((long)(J->cur).ir + (ulong)uVar2 * 8 + 4) & 0x1f) == 5) !=
               ((*(byte *)((long)(J->cur).ir + (ulong)uVar3 * 8 + 4) & 0x1f) == 5)) {
        return 0;
      }
    }
    uVar1 = (pIVar4->field_0).prev;
  } while( true );
}

Assistant:

int lj_opt_fwd_wasnonnil(jit_State *J, IROpT loadop, IRRef xref)
{
  /* First check stores. */
  IRRef ref = J->chain[loadop+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    if (store->op1 == xref) {  /* Same xREF. */
      /* A nil store MAY alias, but a non-nil store MUST alias. */
      return !irt_isnil(store->t);
    } else if (irt_isnil(store->t)) {  /* Must check any nil store. */
      IRRef skref = IR(store->op1)->op2;
      IRRef xkref = IR(xref)->op2;
      /* Same key type MAY alias. Need ALOAD check due to multiple int types. */
      if (loadop == IR_ALOAD || irt_sametype(IR(skref)->t, IR(xkref)->t)) {
	if (skref == xkref || !irref_isk(skref) || !irref_isk(xkref))
	  return 0;  /* A nil store with same const key or var key MAY alias. */
	/* Different const keys CANNOT alias. */
      } else if (irt_isp32(IR(skref)->t) != irt_isp32(IR(xkref)->t)) {
	return 0;  /* HREF and HREFK MAY alias. */
      }  /* Different key types CANNOT alias. */
    }  /* Other non-nil stores MAY alias. */
    ref = store->prev;
  }

  /* Check loads since nothing could be derived from stores. */
  ref = J->chain[loadop];
  while (ref > xref) {
    IRIns *load = IR(ref);
    if (load->op1 == xref) {  /* Same xREF. */
      /* A nil load MAY alias, but a non-nil load MUST alias. */
      return !irt_isnil(load->t);
    }  /* Other non-nil loads MAY alias. */
    ref = load->prev;
  }
  return 0;  /* Nothing derived at all, previous value MAY be nil. */
}